

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QRectF>::emplace<QRectF_const&>
          (QMovableArrayOps<QRectF> *this,qsizetype i,QRectF *args)

{
  QRectF **ppQVar1;
  QRectF *pQVar2;
  qreal *pqVar3;
  Data *pDVar4;
  long lVar5;
  QRectF *pQVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  qsizetype *pqVar11;
  bool bVar12;
  
  pDVar4 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar5 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5) +
        lVar5)) {
      pQVar6 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
      qVar7 = args->xp;
      qVar8 = args->yp;
      qVar9 = args->h;
      pqVar3 = &pQVar6[lVar5].w;
      *pqVar3 = args->w;
      pqVar3[1] = qVar9;
      pQVar6 = pQVar6 + lVar5;
      pQVar6->xp = qVar7;
      pQVar6->yp = qVar8;
      goto LAB_0060113d;
    }
    if (((i == 0) && (pDVar4 != (Data *)0x0)) &&
       ((QRectF *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr)) {
      pQVar6 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
      qVar7 = args->xp;
      qVar8 = args->yp;
      qVar9 = args->h;
      pQVar6[-1].w = args->w;
      pQVar6[-1].h = qVar9;
      pQVar6[-1].xp = qVar7;
      pQVar6[-1].yp = qVar8;
      ppQVar1 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      goto LAB_0060113d;
    }
  }
  qVar7 = args->xp;
  qVar8 = args->yp;
  qVar9 = args->w;
  qVar10 = args->h;
  bVar12 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size != 0;
  QArrayDataPointer<QRectF>::detachAndGrow
            ((QArrayDataPointer<QRectF> *)this,(uint)(i == 0 && bVar12),1,(QRectF **)0x0,
             (QArrayDataPointer<QRectF> *)0x0);
  pQVar6 = (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr;
  if (i == 0 && bVar12) {
    pQVar6[-1].xp = qVar7;
    pQVar6[-1].yp = qVar8;
    pQVar6[-1].w = qVar9;
    pQVar6[-1].h = qVar10;
    (this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.ptr = pQVar6 + -1;
  }
  else {
    pQVar2 = pQVar6 + i;
    memmove(pQVar2 + 1,pQVar6 + i,
            ((this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size - i) * 0x20
           );
    pQVar2->xp = qVar7;
    pQVar2->yp = qVar8;
    pQVar2->w = qVar9;
    pQVar2->h = qVar10;
  }
LAB_0060113d:
  pqVar11 = &(this->super_QGenericArrayOps<QRectF>).super_QArrayDataPointer<QRectF>.size;
  *pqVar11 = *pqVar11 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }